

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O3

bool __thiscall
Js::BufferReader::ReadArray<Js::LdLenInfo>(BufferReader *this,LdLenInfo *data,size_t len)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong sizeInBytes;
  
  sizeInBytes = len * 4;
  uVar1 = this->lengthLeft;
  if (uVar1 < sizeInBytes) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3d6,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  else {
    memcpy_s(data,sizeInBytes,this->current,sizeInBytes);
    this->current = this->current + sizeInBytes;
    this->lengthLeft = this->lengthLeft + len * -4;
  }
  return sizeInBytes <= uVar1;
}

Assistant:

bool ReadArray(__inout_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                AssertOrFailFast(false);
                return false;
            }
            memcpy_s(data, size, current, size);
            current += size;
            lengthLeft -= size;
            return true;
        }